

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

void __thiscall
CVmObjFrameRef::restore_from_file
          (CVmObjFrameRef *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  uint uVar4;
  vm_frameref_ext *this_00;
  vm_frameref_ext *pvVar5;
  ulong uVar6;
  CVmObjTable *in_RCX;
  CVmFile *in_RDI;
  vm_val_t *v;
  int i;
  vm_frameref_ext *ext;
  int nparams;
  int nlocals;
  char buf [5];
  vm_val_t *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  vm_val_t *buf_00;
  undefined4 in_stack_ffffffffffffffc0;
  vm_obj_id_t in_stack_ffffffffffffffc4;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  
  iVar1 = CVmFile::read_int2(in_RDI);
  iVar2 = CVmFile::read_int2(in_RDI);
  this_00 = alloc_ext((CVmObjFrameRef *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8
                     );
  pvVar5 = get_ext((CVmObjFrameRef *)in_RDI);
  pvVar5->fp = (vm_val_t *)0x0;
  CVmFile::read_bytes((CVmFile *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,(size_t)in_RDI);
  CVmObjFixup::fix_dh((CVmObjFixup *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  vmb_get_dh((char *)in_RDI,in_stack_ffffffffffffffa8);
  CVmObjTable::request_post_load_init(in_RCX,in_stack_ffffffffffffffdc);
  CVmFile::read_bytes((CVmFile *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,(size_t)in_RDI);
  CVmObjFixup::fix_dh((CVmObjFixup *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  vmb_get_dh((char *)in_RDI,in_stack_ffffffffffffffa8);
  uVar6 = CVmFile::read_uint4(in_RDI);
  this_00->defobj = (vm_obj_id_t)uVar6;
  if (this_00->defobj != 0) {
    vVar3 = CVmObjFixup::get_new_id((CVmObjFixup *)this_00,in_stack_ffffffffffffffc4);
    this_00->defobj = vVar3;
  }
  uVar6 = CVmFile::read_uint4(in_RDI);
  this_00->targobj = (vm_obj_id_t)uVar6;
  if (this_00->targobj != 0) {
    vVar3 = CVmObjFixup::get_new_id((CVmObjFixup *)this_00,in_stack_ffffffffffffffc4);
    this_00->targobj = vVar3;
  }
  uVar4 = CVmFile::read_uint2(in_RDI);
  this_00->targprop = (vm_prop_id_t)uVar4;
  CVmFile::read_bytes((CVmFile *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,(size_t)in_RDI);
  CVmObjFixup::fix_dh((CVmObjFixup *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  vmb_get_dh((char *)in_RDI,in_stack_ffffffffffffffa8);
  buf_00 = this_00->vars;
  for (iVar1 = iVar1 + iVar2; 0 < iVar1; iVar1 = iVar1 + -1) {
    CVmFile::read_bytes((CVmFile *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),(char *)buf_00,
                        (size_t)in_RDI);
    CVmObjFixup::fix_dh((CVmObjFixup *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),(char *)buf_00);
    vmb_get_dh((char *)in_RDI,in_stack_ffffffffffffffa8);
    buf_00 = buf_00 + 1;
  }
  return;
}

Assistant:

void CVmObjFrameRef::restore_from_file(VMG_ vm_obj_id_t self,
                                       class CVmFile *fp,
                                       class CVmObjFixup *fixups)
{
    char buf[VMB_DATAHOLDER];
    
    /* read the variables counts */
    int nlocals = fp->read_int2();
    int nparams = fp->read_int2();

    /* allocate the extension */
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* 
     *   Since stack frames are inherently transient, a saved frame ref
     *   object can't point back to a live stack frame, so on restore we have
     *   to assume that our stack frame is inactive. 
     */
    get_ext()->fp = 0;

    /* load the entry pointer */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->entry);

    /* after other objects are loaded, resolve the entry pointer */
    G_obj_table->request_post_load_init(self);

    /* restore the method context values */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->self);

    ext->defobj = (vm_obj_id_t)fp->read_uint4();
    if (ext->defobj != VM_INVALID_OBJ)
        ext->defobj = fixups->get_new_id(vmg_ ext->defobj);
    
    ext->targobj = (vm_obj_id_t)fp->read_uint4();
    if (ext->targobj != VM_INVALID_OBJ)
        ext->targobj = fixups->get_new_id(vmg_ ext->targobj);
    
    ext->targprop = (vm_prop_id_t)fp->read_uint2();

    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->invokee);

    /* load the snapshot values */
    int i;
    vm_val_t *v;
    for (i = nlocals + nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        fp->read_bytes(buf, VMB_DATAHOLDER);
        fixups->fix_dh(vmg_ buf);
        vmb_get_dh(buf, v);
    }
}